

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O1

shared_ptr<PathTracer> __thiscall
PathTracer::Create(PathTracer *this,shared_ptr<Octree> *octree,shared_ptr<Camera> *camera,
                  shared_ptr<Lighting> *lighting,shared_ptr<myvk::CommandPool> *command_pool)

{
  PathTracer *this_00;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<PathTracer> sVar3;
  
  (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x1c8);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0032cb08;
  this_00 = (PathTracer *)(p_Var2 + 1);
  memset(this_00,0,0x1b8);
  p_Var2[0x1b]._M_use_count = 0x500;
  p_Var2[0x1b]._M_weak_count = 0x2d0;
  (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  p_Var2[1]._vptr__Sp_counted_base =
       (_func_int **)(octree->super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[1]._M_use_count,
             &(octree->super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  p_Var2[2]._vptr__Sp_counted_base =
       (_func_int **)(camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[2]._M_use_count,
             &(camera->super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  p_Var2[3]._vptr__Sp_counted_base =
       (_func_int **)(lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[3]._M_use_count,
             &(lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  *(undefined4 *)&p_Var2[0x1c]._vptr__Sp_counted_base = 4;
  iVar1 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  Sobol::Initialize((Sobol *)(p_Var2 + 4),(shared_ptr<myvk::Device> *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_noise_images(this_00,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_00,iVar1));
  set_noise_image(this_00,command_pool);
  iVar1 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_descriptor(this_00,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_01,iVar1));
  iVar1 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  create_pipeline(this_00,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_02,iVar1));
  sVar3.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<PathTracer>)sVar3.super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PathTracer> PathTracer::Create(const std::shared_ptr<Octree> &octree,
                                               const std::shared_ptr<Camera> &camera,
                                               const std::shared_ptr<Lighting> &lighting,
                                               const std::shared_ptr<myvk::CommandPool> &command_pool) {
	std::shared_ptr<PathTracer> ret = std::make_shared<PathTracer>();
	ret->m_octree_ptr = octree;
	ret->m_camera_ptr = camera;
	ret->m_lighting_ptr = lighting;

	ret->m_bounce = kDefaultBounce;

	ret->m_sobol.Initialize(command_pool->GetDevicePtr());
	ret->create_noise_images(command_pool->GetDevicePtr());
	ret->set_noise_image(command_pool);
	ret->create_descriptor(command_pool->GetDevicePtr());
	ret->create_pipeline(command_pool->GetDevicePtr());

	return ret;
}